

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O0

void WasmCGenBinary(WasmCGen *cgen,PCSTR function)

{
  char *__s;
  PCSTR this;
  string local_130;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  PCSTR function_local;
  WasmCGen *cgen_local;
  
  local_18 = function;
  function_local = (PCSTR)cgen;
  printf("/*%s*/\n","WasmCGenBinary");
  this = function_local;
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,__s,&local_d9);
  std::operator+(&local_b8,&local_d8,"(");
  w3SourceGen::pop_abi_cxx11_(&local_110,(w3SourceGen *)function_local);
  std::operator+(&local_98,&local_b8,&local_110);
  std::operator+(&local_78,&local_98,",");
  w3SourceGen::pop_abi_cxx11_(&local_130,(w3SourceGen *)function_local);
  std::operator+(&local_58,&local_78,&local_130);
  std::operator+(&local_38,&local_58,")");
  w3SourceGen::push((w3SourceGen *)this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  return;
}

Assistant:

void WasmCGenBinary (WasmCGen* cgen, PCSTR function)
{
    printf ("/*%s*/\n", __func__);
    cgen->push (string (function) + "(" + cgen->pop () + "," + cgen->pop () + ")");
}